

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phmap.h
# Opt level: O2

void __thiscall
phmap::priv::
parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_std::mutex,_phmap::priv::FlatHashMapPolicy<phmap::priv::hash_internal::EnumClass,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::hash_internal::EnumClass,_int>_>_>
::clear(parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_std::mutex,_phmap::priv::FlatHashMapPolicy<phmap::priv::hash_internal::EnumClass,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::hash_internal::EnumClass,_int>_>_>
        *this)

{
  long lVar1;
  UniqueLock m;
  WriteLock local_28;
  
  for (lVar1 = 0x700; lVar1 != 0; lVar1 = lVar1 + -0x70) {
    local_28.m_ = (mutex_type *)this;
    std::mutex::lock((mutex *)this);
    local_28.locked_ = true;
    raw_hash_set<phmap::priv::FlatHashMapPolicy<phmap::priv::hash_internal::EnumClass,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::hash_internal::EnumClass,_int>_>_>
    ::clear(&((Inner *)this)->set_);
    LockableBaseImpl<std::mutex>::WriteLock::~WriteLock(&local_28);
    this = (parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_std::mutex,_phmap::priv::FlatHashMapPolicy<phmap::priv::hash_internal::EnumClass,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::hash_internal::EnumClass,_int>_>_>
            *)((long)this + 0x70);
  }
  return;
}

Assistant:

PHMAP_ATTRIBUTE_REINITIALIZES void clear() {
        for (auto& inner : sets_)
        {
            UniqueLock m(inner);
            inner.set_.clear();
        }
    }